

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool processSources(cmGeneratorTarget *tgt,
                   vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                   *entries,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *srcs,
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *uniqueSrcs,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
                   bool debugSources)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  cmMakefile *this;
  reference ppTVar4;
  cmCompiledGeneratorExpression *pcVar5;
  cmLocalGenerator *pcVar6;
  char *pcVar7;
  cmSourceFile *this_00;
  ostream *poVar8;
  reference pbVar9;
  ulong uVar10;
  cmake *pcVar11;
  string *psVar12;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar13;
  cmListFileBacktrace local_460;
  allocator local_439;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_378;
  undefined1 local_370;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_368;
  undefined1 local_360;
  undefined1 local_358 [8];
  string src_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_330;
  iterator li;
  string usedSources;
  undefined1 local_2e8 [8];
  ostringstream err;
  cmListFileBacktrace local_168;
  cmake *local_148;
  cmake *cm;
  string fullPath;
  string e;
  cmSourceFile *sf;
  string *src;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  iterator i;
  string local_d0;
  string local_b0;
  undefined1 local_90 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entrySources;
  string *targetName;
  cmLinkImplItem *item;
  const_iterator end;
  const_iterator it;
  bool contextDependent;
  cmMakefile *mf;
  bool debugSources_local;
  string *config_local;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *uniqueSrcs_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *srcs_local;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *entries_local;
  cmGeneratorTarget *tgt_local;
  
  this = cmTarget::GetMakefile(tgt->Target);
  bVar1 = 0;
  end = std::
        vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
        ::begin(entries);
  item = (cmLinkImplItem *)
         std::
         vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
         ::end(entries);
  while (bVar3 = __gnu_cxx::operator!=
                           (&end,(__normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
                                  *)&item), bVar2 = bVar1, bVar3) {
    ppTVar4 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
              ::operator*(&end);
    entrySources.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(*ppTVar4)->LinkImplItem;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_90);
    ppTVar4 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
              ::operator*(&end);
    pcVar5 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->(&(*ppTVar4)->ge);
    pcVar6 = cmGeneratorTarget::GetLocalGenerator(tgt);
    std::__cxx11::string::string((string *)&local_d0);
    pcVar7 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar5,pcVar6,config,false,tgt,tgt,dagChecker,&local_d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b0,pcVar7,(allocator *)((long)&i._M_current + 3));
    cmSystemTools::ExpandListArgument
              (&local_b0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_90,false);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i._M_current + 3));
    std::__cxx11::string::~string((string *)&local_d0);
    ppTVar4 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
              ::operator*(&end);
    pcVar5 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->(&(*ppTVar4)->ge);
    bVar3 = cmCompiledGeneratorExpression::GetHadContextSensitiveCondition(pcVar5);
    if (bVar3) {
      bVar1 = 1;
    }
    local_e8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_90);
    while( true ) {
      src = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_90);
      bVar3 = __gnu_cxx::operator!=
                        (&local_e8,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&src);
      if (!bVar3) break;
      pbVar9 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_e8);
      this_00 = cmMakefile::GetOrCreateSource(this,pbVar9,false);
      std::__cxx11::string::string((string *)(fullPath.field_2._M_local_buf + 8));
      psVar12 = cmSourceFile::GetFullPath(this_00,(string *)(fullPath.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&cm,(string *)psVar12);
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        uVar10 = std::__cxx11::string::empty();
        if ((uVar10 & 1) == 0) {
          pcVar7 = (char *)std::__cxx11::string::c_str();
          bVar3 = cmsys::SystemTools::FileIsFullPath(pcVar7);
          if (!bVar3) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e8);
            uVar10 = std::__cxx11::string::empty();
            if ((uVar10 & 1) == 0) {
              poVar8 = std::operator<<((ostream *)local_2e8,"Target \"");
              poVar8 = std::operator<<(poVar8,(string *)
                                              entrySources.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              poVar8 = std::operator<<(poVar8,
                                       "\" contains relative path in its INTERFACE_SOURCES:\n  \"");
              poVar8 = std::operator<<(poVar8,(string *)pbVar9);
              std::operator<<(poVar8,"\"");
            }
            else {
              poVar8 = std::operator<<((ostream *)local_2e8,
                                       "Found relative path while evaluating sources of \"");
              psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
              poVar8 = std::operator<<(poVar8,(string *)psVar12);
              poVar8 = std::operator<<(poVar8,"\":\n  \"");
              poVar8 = std::operator<<(poVar8,(string *)pbVar9);
              std::operator<<(poVar8,"\"\n");
            }
            pcVar6 = cmGeneratorTarget::GetLocalGenerator(tgt);
            std::__cxx11::ostringstream::str();
            cmLocalGenerator::IssueMessage
                      (pcVar6,FATAL_ERROR,(string *)((long)&usedSources.field_2 + 8));
            std::__cxx11::string::~string((string *)(usedSources.field_2._M_local_buf + 8));
            bVar3 = true;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e8);
            tgt_local._7_1_ = bVar1;
            goto LAB_008bb041;
          }
        }
        std::__cxx11::string::operator=((string *)pbVar9,(string *)&cm);
        bVar3 = false;
      }
      else {
        uVar10 = std::__cxx11::string::empty();
        if ((uVar10 & 1) == 0) {
          pcVar6 = cmGeneratorTarget::GetLocalGenerator(tgt);
          pcVar11 = cmLocalGenerator::GetCMakeInstance(pcVar6);
          local_148 = pcVar11;
          cmGeneratorTarget::GetBacktrace(&local_168,tgt);
          cmake::IssueMessage(pcVar11,FATAL_ERROR,(string *)((long)&fullPath.field_2 + 8),&local_168
                             );
          cmListFileBacktrace::~cmListFileBacktrace(&local_168);
        }
        bVar3 = true;
        tgt_local._7_1_ = bVar1;
      }
LAB_008bb041:
      std::__cxx11::string::~string((string *)&cm);
      std::__cxx11::string::~string((string *)(fullPath.field_2._M_local_buf + 8));
      if (bVar3) goto LAB_008bb4ae;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_e8);
    }
    std::__cxx11::string::string((string *)&li);
    local_330._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_90);
    while( true ) {
      src_1.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_90);
      bVar3 = __gnu_cxx::operator!=
                        (&local_330,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&src_1.field_2 + 8));
      if (!bVar3) break;
      pbVar9 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_330);
      std::__cxx11::string::string((string *)local_358,(string *)pbVar9);
      pVar13 = std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert(uniqueSrcs,(value_type *)local_358);
      local_378._M_cur =
           (__node_type *)
           pVar13.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_370 = pVar13.second;
      local_368._M_cur = local_378._M_cur;
      local_360 = local_370;
      if ((((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
         (std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(srcs,(value_type *)local_358), debugSources)) {
        std::operator+(&local_3b8," * ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_358);
        std::operator+(&local_398,&local_3b8,"\n");
        std::__cxx11::string::operator+=((string *)&li,(string *)&local_398);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&local_3b8);
      }
      std::__cxx11::string::~string((string *)local_358);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_330);
    }
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      pcVar6 = cmGeneratorTarget::GetLocalGenerator(tgt);
      pcVar11 = cmLocalGenerator::GetCMakeInstance(pcVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_438,"Used sources for target ",&local_439);
      psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
      std::operator+(&local_418,&local_438,psVar12);
      std::operator+(&local_3f8,&local_418,":\n");
      std::operator+(&local_3d8,&local_3f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&li);
      ppTVar4 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
                ::operator*(&end);
      pcVar5 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->(&(*ppTVar4)->ge);
      cmCompiledGeneratorExpression::GetBacktrace(&local_460,pcVar5);
      cmake::IssueMessage(pcVar11,LOG,&local_3d8,&local_460);
      cmListFileBacktrace::~cmListFileBacktrace(&local_460);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::string::~string((string *)&local_438);
      std::allocator<char>::~allocator((allocator<char> *)&local_439);
    }
    std::__cxx11::string::~string((string *)&li);
    bVar3 = false;
LAB_008bb4ae:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_90);
    bVar2 = tgt_local._7_1_;
    if (bVar3) break;
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
    ::operator++(&end);
  }
  tgt_local._7_1_ = bVar2;
  return (bool)(tgt_local._7_1_ & 1);
}

Assistant:

static bool processSources(
  cmGeneratorTarget const* tgt,
  const std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries,
  std::vector<std::string>& srcs, CM_UNORDERED_SET<std::string>& uniqueSrcs,
  cmGeneratorExpressionDAGChecker* dagChecker, std::string const& config,
  bool debugSources)
{
  cmMakefile* mf = tgt->Target->GetMakefile();

  bool contextDependent = false;

  for (std::vector<cmGeneratorTarget::TargetPropertyEntry *>::const_iterator
         it = entries.begin(),
         end = entries.end();
       it != end; ++it) {
    cmLinkImplItem const& item = (*it)->LinkImplItem;
    std::string const& targetName = item;
    std::vector<std::string> entrySources;
    cmSystemTools::ExpandListArgument(
      (*it)->ge->Evaluate(tgt->GetLocalGenerator(), config, false, tgt, tgt,
                          dagChecker),
      entrySources);

    if ((*it)->ge->GetHadContextSensitiveCondition()) {
      contextDependent = true;
    }

    for (std::vector<std::string>::iterator i = entrySources.begin();
         i != entrySources.end(); ++i) {
      std::string& src = *i;
      cmSourceFile* sf = mf->GetOrCreateSource(src);
      std::string e;
      std::string fullPath = sf->GetFullPath(&e);
      if (fullPath.empty()) {
        if (!e.empty()) {
          cmake* cm = tgt->GetLocalGenerator()->GetCMakeInstance();
          cm->IssueMessage(cmake::FATAL_ERROR, e, tgt->GetBacktrace());
        }
        return contextDependent;
      }

      if (!targetName.empty() && !cmSystemTools::FileIsFullPath(src.c_str())) {
        std::ostringstream err;
        if (!targetName.empty()) {
          err << "Target \"" << targetName
              << "\" contains relative "
                 "path in its INTERFACE_SOURCES:\n"
                 "  \""
              << src << "\"";
        } else {
          err << "Found relative path while evaluating sources of "
                 "\""
              << tgt->GetName() << "\":\n  \"" << src << "\"\n";
        }
        tgt->GetLocalGenerator()->IssueMessage(cmake::FATAL_ERROR, err.str());
        return contextDependent;
      }
      src = fullPath;
    }
    std::string usedSources;
    for (std::vector<std::string>::iterator li = entrySources.begin();
         li != entrySources.end(); ++li) {
      std::string src = *li;

      if (uniqueSrcs.insert(src).second) {
        srcs.push_back(src);
        if (debugSources) {
          usedSources += " * " + src + "\n";
        }
      }
    }
    if (!usedSources.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        cmake::LOG, std::string("Used sources for target ") + tgt->GetName() +
          ":\n" + usedSources,
        (*it)->ge->GetBacktrace());
    }
  }
  return contextDependent;
}